

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YolactDetector.cpp
# Opt level: O2

int __thiscall
Yolact::draw(Yolact *this,Mat *image,vector<Object,_std::allocator<Object>_> *objects)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int y;
  int iVar5;
  long lVar6;
  pointer pOVar7;
  long lVar8;
  byte *pbVar9;
  int iVar10;
  double dVar11;
  __m128 t_2;
  __m128 t;
  allocator local_1f1;
  int baseLine;
  int local_1ec;
  Size label_size;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  undefined4 local_1b0 [2];
  Mat *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  Mat *pMStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  vector<Object,_std::allocator<Object>_> *local_178;
  long local_170;
  double local_168;
  double dStack_160;
  Matx<double,_4,_1> local_158;
  char text [256];
  
  local_170 = 0;
  iVar10 = 0;
  local_178 = objects;
  do {
    pOVar7 = (objects->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
             super__Vector_impl_data._M_start;
    dVar11 = (double)pOVar7[local_170].prob;
    if (0.15 <= dVar11) {
      pOVar7 = pOVar7 + local_170;
      fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",dVar11,(double)(pOVar7->rect).x,
              (double)(pOVar7->rect).y,(double)(pOVar7->rect).width,(double)(pOVar7->rect).height,
              (ulong)(uint)pOVar7->label);
      local_188 = 0;
      local_198 = CONCAT44(local_198._4_4_,0x3010000);
      local_1c0 = (int)ROUND((pOVar7->rect).x);
      local_1bc = (int)ROUND((pOVar7->rect).y);
      local_1b8 = (int)ROUND((pOVar7->rect).width);
      local_1b4 = (int)ROUND((pOVar7->rect).height);
      bVar1 = draw::colors[iVar10][2];
      local_1ec = iVar10;
      pMStack_190 = image;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)text);
      local_168 = (double)(*(ushort *)draw::colors[iVar10] & 0xff);
      dStack_160 = (double)(byte)(*(ushort *)draw::colors[iVar10] >> 8);
      text[0x18] = '\0';
      text[0x19] = '\0';
      text[0x1a] = '\0';
      text[0x1b] = '\0';
      text[0x1c] = '\0';
      text[0x1d] = '\0';
      text[0x1e] = '\0';
      text[0x1f] = '\0';
      text._0_8_ = local_168;
      text._8_8_ = dStack_160;
      text._16_8_ = (double)bVar1;
      cv::rectangle((string *)&local_198,&local_1c0,(Matx<double,_4,_1> *)text,1,8,0);
      sprintf(text,"%s %.1f%%",(double)(pOVar7->prob * 100.0),draw::class_names[pOVar7->label]);
      baseLine = 0;
      std::__cxx11::string::string((string *)&local_198,text,(allocator *)local_1b0);
      cv::getTextSize((string *)&label_size,(int)(string *)&local_198,0.5,0,(int *)0x1);
      std::__cxx11::string::~string((string *)&local_198);
      iVar5 = (int)(pOVar7->rect).x;
      iVar10 = (int)(((pOVar7->rect).y - (float)label_size.height) - (float)baseLine);
      if (iVar10 < 1) {
        iVar10 = 0;
      }
      iVar4 = *(int *)(image + 0xc) - label_size.width;
      if (label_size.width + iVar5 <= *(int *)(image + 0xc)) {
        iVar4 = iVar5;
      }
      local_1a0 = 0;
      local_1b0[0] = 0x3010000;
      local_1c4 = baseLine + label_size.height;
      local_1c8 = label_size.width;
      local_1d0 = iVar4;
      local_1cc = iVar10;
      local_1a8 = image;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_198);
      local_198 = 0x406fe00000000000;
      pMStack_190 = (Mat *)0x406fe00000000000;
      local_188 = 0x406fe00000000000;
      uStack_180 = 0;
      cv::rectangle((allocator *)local_1b0,&local_1d0,(string *)&local_198,0xffffffffffffffff,8,0);
      local_1a0 = 0;
      local_1b0[0] = 0x3010000;
      local_1a8 = image;
      std::__cxx11::string::string((string *)&local_198,text,&local_1f1);
      local_1d4 = iVar10 + label_size.height;
      local_1d8 = iVar4;
      cv::Matx<double,_4,_1>::Matx(&local_158);
      local_158.val[2] = 0.0;
      local_158.val[3] = 0.0;
      local_158.val[0] = 0.0;
      local_158.val[1] = 0.0;
      cv::putText(0x3fe0000000000000,(allocator *)local_1b0,(string *)&local_198,&local_1d8,0,
                  &local_158,1,8,0);
      iVar10 = local_1ec + 1;
      std::__cxx11::string::~string((string *)&local_198);
      for (lVar6 = 0; objects = local_178, lVar6 < *(int *)(image + 8); lVar6 = lVar6 + 1) {
        lVar2 = **(long **)&pOVar7->field_0x78;
        lVar3 = *(long *)&pOVar7->field_0x40;
        pbVar9 = (byte *)(*(long *)(image + 0x10) + **(long **)(image + 0x48) * lVar6 + 2);
        for (lVar8 = 0; lVar8 < *(int *)(image + 0xc); lVar8 = lVar8 + 1) {
          if (*(char *)(lVar2 * lVar6 + lVar3 + lVar8) == -1) {
            iVar5 = (int)ROUND((double)pbVar9[-2] * 0.5 + local_168 * 0.5);
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (0xfe < iVar5) {
              iVar5 = 0xff;
            }
            pbVar9[-2] = (byte)iVar5;
            iVar5 = (int)ROUND((double)pbVar9[-1] * 0.5 + dStack_160 * 0.5);
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (0xfe < iVar5) {
              iVar5 = 0xff;
            }
            pbVar9[-1] = (byte)iVar5;
            iVar5 = (int)ROUND((double)*pbVar9 * 0.5 + (double)bVar1 * 0.5);
            if (iVar5 < 1) {
              iVar5 = 0;
            }
            if (0xfe < iVar5) {
              iVar5 = 0xff;
            }
            *pbVar9 = (byte)iVar5;
          }
          pbVar9 = pbVar9 + 3;
        }
      }
    }
    local_170 = local_170 + 1;
  } while( true );
}

Assistant:

int Yolact::draw(cv::Mat& image, const std::vector<Object>& objects) 
{
    static const char* class_names[] = {"background",
                                        "person", "bicycle", "car", "motorcycle", "airplane", "bus",
                                        "train", "truck", "boat", "traffic light", "fire hydrant",
                                        "stop sign", "parking meter", "bench", "bird", "cat", "dog",
                                        "horse", "sheep", "cow", "elephant", "bear", "zebra", "giraffe",
                                        "backpack", "umbrella", "handbag", "tie", "suitcase", "frisbee",
                                        "skis", "snowboard", "sports ball", "kite", "baseball bat",
                                        "baseball glove", "skateboard", "surfboard", "tennis racket",
                                        "bottle", "wine glass", "cup", "fork", "knife", "spoon", "bowl",
                                        "banana", "apple", "sandwich", "orange", "broccoli", "carrot",
                                        "hot dog", "pizza", "donut", "cake", "chair", "couch",
                                        "potted plant", "bed", "dining table", "toilet", "tv", "laptop",
                                        "mouse", "remote", "keyboard", "cell phone", "microwave", "oven",
                                        "toaster", "sink", "refrigerator", "book", "clock", "vase",
                                        "scissors", "teddy bear", "hair drier", "toothbrush"
                                       };

    static const unsigned char colors[19][3] = {
        {244, 67, 54},
        {233, 30, 99},
        {156, 39, 176},
        {103, 58, 183},
        {63, 81, 181},
        {33, 150, 243},
        {3, 169, 244},
        {0, 188, 212},
        {0, 150, 136},
        {76, 175, 80},
        {139, 195, 74},
        {205, 220, 57},
        {255, 235, 59},
        {255, 193, 7},
        {255, 152, 0},
        {255, 87, 34},
        {121, 85, 72},
        {158, 158, 158},
        {96, 125, 139}
    };

    //cv::Mat image = bgr.clone();

    int color_index = 0;

    for (size_t i = 0; i < objects.size(); i++)
    {
        const Object& obj = objects[i];

        if (obj.prob < 0.15)
            continue;

        fprintf(stderr, "%d = %.5f at %.2f %.2f %.2f x %.2f\n", obj.label, obj.prob,
                obj.rect.x, obj.rect.y, obj.rect.width, obj.rect.height);

        const unsigned char* color = colors[color_index++];

        cv::rectangle(image, obj.rect, cv::Scalar(color[0], color[1], color[2]));

        char text[256];
        sprintf(text, "%s %.1f%%", class_names[obj.label], obj.prob * 100);

        int baseLine = 0;
        cv::Size label_size = cv::getTextSize(text, cv::FONT_HERSHEY_SIMPLEX, 0.5, 1, &baseLine);

        int x = obj.rect.x;
        int y = obj.rect.y - label_size.height - baseLine;
        if (y < 0)
            y = 0;
        if (x + label_size.width > image.cols)
            x = image.cols - label_size.width;

        cv::rectangle(image, cv::Rect(cv::Point(x, y), cv::Size(label_size.width, label_size.height + baseLine)),
                      cv::Scalar(255, 255, 255), -1);

        cv::putText(image, text, cv::Point(x, y + label_size.height),
                    cv::FONT_HERSHEY_SIMPLEX, 0.5, cv::Scalar(0, 0, 0));

        // draw mask
        for (int y = 0; y < image.rows; y++)
        {
            const uchar* mp = obj.mask.ptr(y);
            uchar* p = image.ptr(y);
            for (int x = 0; x < image.cols; x++)
            {
                if (mp[x] == 255)
                {
                    p[0] = cv::saturate_cast<uchar>(p[0] * 0.5 + color[0] * 0.5);
                    p[1] = cv::saturate_cast<uchar>(p[1] * 0.5 + color[1] * 0.5);
                    p[2] = cv::saturate_cast<uchar>(p[2] * 0.5 + color[2] * 0.5);
                }
                p += 3;
            }
        }
    }

    // cv::imwrite("result.png", image);
    // cv::imshow("image", image);
    // cv::waitKey(0);
}